

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QRect __thiscall QVariant::toRect(QVariant *this)

{
  QRect QVar1;
  
  QVar1 = qvariant_cast<QRect>(this);
  return QVar1;
}

Assistant:

QRect QVariant::toRect() const
{
    return qvariant_cast<QRect>(*this);
}